

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::IsInfiniteFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  undefined4 in_stack_fffffffffffff7a4;
  undefined4 in_stack_fffffffffffff7ac;
  FunctionNullHandling in_stack_fffffffffffff7b8;
  allocator_type local_841;
  bind_lambda_function_t in_stack_fffffffffffff7c0;
  scalar_function_t local_820;
  scalar_function_t local_800;
  scalar_function_t local_7e0;
  scalar_function_t local_7c0;
  scalar_function_t local_7a0;
  LogicalType local_780;
  vector<duckdb::LogicalType,_true> local_768;
  LogicalType local_750;
  vector<duckdb::LogicalType,_true> local_738;
  LogicalType local_720;
  vector<duckdb::LogicalType,_true> local_708;
  LogicalType local_6f0;
  vector<duckdb::LogicalType,_true> local_6d8;
  LogicalType local_6c0;
  vector<duckdb::LogicalType,_true> local_6a8;
  LogicalType local_690;
  LogicalType local_678;
  LogicalType local_660;
  LogicalType local_648;
  LogicalType local_630;
  string local_618;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"isinf","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p);
  }
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7c0,FLOAT);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffff7c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_6a8,__l,
             &local_841);
  LogicalType::LogicalType(&local_6c0,BOOLEAN);
  local_7a0.super__Function_base._M_functor._8_8_ = 0;
  local_7a0.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<float,bool,duckdb::IsInfiniteOperator>;
  local_7a0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_7a0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_630,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_630;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff7a4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff7ac;
  ScalarFunction::ScalarFunction
            (&local_158,&local_6a8,&local_6c0,&local_7a0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7c0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)&local_158.function,(_Any_data *)&local_158.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_630);
  if (local_7a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7a0.super__Function_base._M_manager)
              ((_Any_data *)&local_7a0,(_Any_data *)&local_7a0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_6c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_6a8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7c0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7c0,DOUBLE);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffff7c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_6d8,__l_00,
             &local_841);
  LogicalType::LogicalType(&local_6f0,BOOLEAN);
  local_7c0.super__Function_base._M_functor._8_8_ = 0;
  local_7c0.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<double,bool,duckdb::IsInfiniteOperator>;
  local_7c0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_7c0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_648,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_648;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7a4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7ac;
  ScalarFunction::ScalarFunction
            (&local_280,&local_6d8,&local_6f0,&local_7c0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_648);
  if (local_7c0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7c0.super__Function_base._M_manager)
              ((_Any_data *)&local_7c0,(_Any_data *)&local_7c0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_6f0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_6d8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7c0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7c0,DATE);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&stack0xfffffffffffff7c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_708,__l_01,
             &local_841);
  LogicalType::LogicalType(&local_720,BOOLEAN);
  local_7e0.super__Function_base._M_functor._8_8_ = 0;
  local_7e0.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<duckdb::date_t,bool,duckdb::IsInfiniteOperator>;
  local_7e0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_7e0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_660,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_660;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7a4;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7ac;
  ScalarFunction::ScalarFunction
            (&local_3a8,&local_708,&local_720,&local_7e0,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_01,CONSISTENT,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_3a8.function,(_Any_data *)&local_3a8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_660);
  if (local_7e0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7e0.super__Function_base._M_manager)
              ((_Any_data *)&local_7e0,(_Any_data *)&local_7e0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_720);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_708);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7c0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7c0,TIMESTAMP);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&stack0xfffffffffffff7c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_738,__l_02,
             &local_841);
  LogicalType::LogicalType(&local_750,BOOLEAN);
  local_800.super__Function_base._M_functor._8_8_ = 0;
  local_800.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<duckdb::timestamp_t,bool,duckdb::IsInfiniteOperator>;
  local_800._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_800.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_678,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_678;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7a4;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7ac;
  ScalarFunction::ScalarFunction
            (&local_4d0,&local_738,&local_750,&local_800,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_02,CONSISTENT,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_4d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_4d0.function,(_Any_data *)&local_4d0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_4d0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_678);
  if (local_800.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_800.super__Function_base._M_manager)
              ((_Any_data *)&local_800,(_Any_data *)&local_800,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_750);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_738);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7c0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff7c0,TIMESTAMP_TZ);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&stack0xfffffffffffff7c0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_768,__l_03,
             &local_841);
  LogicalType::LogicalType(&local_780,BOOLEAN);
  local_820.super__Function_base._M_functor._8_8_ = 0;
  local_820.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::UnaryFunction<duckdb::timestamp_t,bool,duckdb::IsInfiniteOperator>;
  local_820._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_820.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_690,INVALID);
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_03._0_8_ = &local_690;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff7a4;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_03.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff7ac;
  ScalarFunction::ScalarFunction
            (&local_5f8,&local_768,&local_780,&local_820,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_03,CONSISTENT,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7c0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_5f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_5f8.function,(_Any_data *)&local_5f8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_5f8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_690);
  if (local_820.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_820.super__Function_base._M_manager)
              ((_Any_data *)&local_820,(_Any_data *)&local_820,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_780);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_768);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff7c0);
  return in_RDI;
}

Assistant:

ScalarFunctionSet IsInfiniteFun::GetFunctions() {
	ScalarFunctionSet funcs("isinf");
	funcs.AddFunction(ScalarFunction({LogicalType::FLOAT}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<float, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<double, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DATE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<date_t, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsInfiniteOperator>));
	return funcs;
}